

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O0

bool __thiscall Initialize::CreateFiles(Initialize *this)

{
  byte bVar1;
  ulong uVar2;
  Tools *pTVar3;
  size_type sVar4;
  reference pvVar5;
  Logger *pLVar6;
  allocator<char> local_519;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  int local_474;
  undefined1 local_470 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  int local_42c;
  byte local_425;
  int i;
  bool isCreated;
  string local_418 [8];
  ifstream file;
  string local_210 [8];
  ofstream newFile;
  Initialize *this_local;
  
  std::ofstream::ofstream(local_210);
  std::ifstream::ifstream(local_418);
  local_425 = 1;
  local_42c = 0;
  while( true ) {
    uVar2 = (ulong)local_42c;
    pTVar3 = Tools::getInstance();
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pTVar3->fileNames);
    if (sVar4 <= uVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                   &this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->fileNames,(long)local_42c);
    std::operator+(&local_450,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                   pvVar5);
    std::ofstream::open(local_210,(_Ios_Openmode)&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)local_470);
    std::ofstream::close();
    local_42c = local_42c + 1;
  }
  local_474 = 0;
  while( true ) {
    uVar2 = (ulong)local_474;
    pTVar3 = Tools::getInstance();
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pTVar3->fileNames);
    if (sVar4 <= uVar2) break;
    std::operator+(&local_4b8,&this->path,"/");
    pTVar3 = Tools::getInstance();
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(pTVar3->fileNames,(long)local_474);
    std::operator+(&local_498,&local_4b8,pvVar5);
    std::ifstream::open(local_418,(_Ios_Openmode)&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      pLVar6 = Logger::getInstance();
      pTVar3 = Tools::getInstance();
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(pTVar3->fileNames,(long)local_474);
      std::operator+(&local_4f8,"File - ",pvVar5);
      std::operator+(&local_4d8,&local_4f8,"didn\'t create");
      Logger::LogError(pLVar6,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      local_425 = 0;
    }
    std::ifstream::close();
    local_474 = local_474 + 1;
  }
  if ((local_425 & 1) != 0) {
    pLVar6 = Logger::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_518,"All files created successfully",&local_519);
    Logger::LogInformation(pLVar6,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
  }
  bVar1 = local_425;
  std::ifstream::~ifstream(local_418);
  std::ofstream::~ofstream(local_210);
  return (bool)(bVar1 & 1);
}

Assistant:

bool CreateFiles() {
        ofstream newFile;
        ifstream file;
        bool isCreated = true;

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            newFile.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            newFile.close();
        }

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError("File - " + Tools::getInstance()->fileNames->at(i) + "didn't create");
                isCreated = false;
            }

            file.close();
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("All files created successfully");
        }

        return isCreated;
    }